

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O3

sc_signed * sc_dt::operator/(sc_signed *__return_storage_ptr__,long u,sc_signed *v)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  sc_length_param *psVar5;
  int iVar6;
  ulong uVar7;
  size_t __n;
  sc_digit ud [3];
  
  iVar1 = v->sgn;
  iVar6 = 1;
  uVar7 = u;
  if (u < 1) {
    if (u == 0) {
      if (iVar1 != 0) {
        psVar5 = sc_context<sc_dt::sc_length_param>::default_value();
        sc_signed::sc_signed(__return_storage_ptr__,psVar5->m_len);
        return __return_storage_ptr__;
      }
      goto LAB_001d73e5;
    }
    uVar7 = -u;
    if ((ulong)u < 0x8000000000000001) {
      uVar7 = 0x8000000000000000;
    }
    iVar6 = -1;
  }
  if (iVar1 != 0) {
    __n = 0xc;
    uVar3 = 0;
    do {
      uVar4 = uVar3;
      ud[uVar4] = (uint)uVar7 & 0x3fffffff;
      __n = __n - 4;
      if (1 < uVar4) break;
      bVar2 = 0x3fffffff < uVar7;
      uVar3 = uVar4 + 1;
      uVar7 = uVar7 >> 0x1e;
    } while (bVar2);
    if (uVar4 < 2) {
      memset(ud + uVar4 + 1,0,__n);
    }
    div_signed_friend(__return_storage_ptr__,(uint)(iVar1 == iVar6) * 2 + -1,0x40,3,ud,v->nbits,
                      v->ndigits,v->digit);
    return __return_storage_ptr__;
  }
LAB_001d73e5:
  sc_core::sc_report_handler::report
            (SC_ERROR,"operation failed","div_by_zero<Type>( Type ) : division by zero",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/datatypes/int/sc_nbutils.h"
             ,0x2a8);
  sc_core::sc_abort();
}

Assistant:

sc_signed
operator/(long u, const sc_signed& v)
{

  small_type s = mul_signs(v.sgn, get_sign(u));

  if (s == SC_ZERO) {
    div_by_zero(v.sgn);  // case 1
    return sc_signed();  // case 2
  }

  CONVERT_LONG_2(u);

  // other cases
  return div_signed_friend(s, BITS_PER_ULONG, DIGITS_PER_ULONG, ud,
                           v.nbits, v.ndigits, v.digit);

}